

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bind_vacuum.cpp
# Opt level: O0

BoundStatement * __thiscall duckdb::Binder::Bind(Binder *this,VacuumStatement *stmt)

{
  bool bVar1;
  StatementProperties *pSVar2;
  BoundStatement *in_RDI;
  StatementProperties *properties;
  templated_unique_single_t vacuum;
  unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true> root;
  BoundStatement *result;
  unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>
  *in_stack_00000340;
  LogicalVacuum *in_stack_00000348;
  Binder *in_stack_00000350;
  allocator_type *in_stack_fffffffffffffe28;
  Binder *in_stack_fffffffffffffe30;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  in_stack_fffffffffffffe38;
  LogicalTypeId in_stack_fffffffffffffe4f;
  LogicalType *in_stack_fffffffffffffe50;
  unique_ptr<duckdb::VacuumInfo,_std::default_delete<duckdb::VacuumInfo>,_true>
  *in_stack_fffffffffffffe68;
  undefined1 **local_160;
  string *local_140;
  undefined1 *local_d8 [3];
  undefined8 *local_c0;
  undefined8 local_b8;
  undefined1 local_92;
  allocator local_91;
  string *local_90;
  string local_88 [32];
  string *local_68;
  undefined8 local_60;
  byte local_19;
  
  local_19 = 0;
  BoundStatement::BoundStatement((BoundStatement *)in_stack_fffffffffffffe30);
  unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>::
  unique_ptr((unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>
              *)0xdef8ac);
  make_uniq<duckdb::LogicalVacuum,duckdb::unique_ptr<duckdb::VacuumInfo,std::default_delete<duckdb::VacuumInfo>,true>>
            (in_stack_fffffffffffffe68);
  unique_ptr<duckdb::LogicalVacuum,_std::default_delete<duckdb::LogicalVacuum>,_true>::operator*
            ((unique_ptr<duckdb::LogicalVacuum,_std::default_delete<duckdb::LogicalVacuum>,_true> *)
             in_stack_fffffffffffffe30);
  BindVacuumTable(in_stack_00000350,in_stack_00000348,in_stack_00000340);
  bVar1 = ::std::unique_ptr::operator_cast_to_bool
                    ((unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>
                      *)0xdef90a);
  if (bVar1) {
    unique_ptr<duckdb::LogicalVacuum,_std::default_delete<duckdb::LogicalVacuum>,_true>::operator->
              ((unique_ptr<duckdb::LogicalVacuum,_std::default_delete<duckdb::LogicalVacuum>,_true>
                *)in_stack_fffffffffffffe30);
    ::std::
    vector<duckdb::unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>_>_>
    ::push_back((vector<duckdb::unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>_>_>
                 *)in_stack_fffffffffffffe30,(value_type *)in_stack_fffffffffffffe28);
  }
  local_92 = 1;
  local_90 = local_88;
  ::std::allocator<char>::allocator();
  ::std::__cxx11::string::string(local_88,"Success",&local_91);
  local_92 = 0;
  local_68 = local_88;
  local_60 = 1;
  ::std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::allocator((allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               *)0xdefa02);
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>::
  vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
          *)in_stack_fffffffffffffe30,in_stack_fffffffffffffe38,
         (allocator_type *)in_stack_fffffffffffffe28);
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>::
  operator=((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
             *)in_stack_fffffffffffffe30,
            (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
             *)in_stack_fffffffffffffe28);
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>::
  ~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
           *)0xdefa4f);
  ::std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::~allocator((allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                *)0xdefa5c);
  local_140 = (string *)&local_68;
  do {
    local_140 = local_140 + -0x20;
    ::std::__cxx11::string::~string(local_140);
  } while (local_140 != local_88);
  ::std::allocator<char>::~allocator((allocator<char> *)&local_91);
  LogicalType::LogicalType(in_stack_fffffffffffffe50,in_stack_fffffffffffffe4f);
  local_c0 = local_d8;
  local_b8 = 1;
  ::std::allocator<duckdb::LogicalType>::allocator((allocator<duckdb::LogicalType> *)0xdefb08);
  vector<duckdb::LogicalType,_true>::vector
            ((vector<duckdb::LogicalType,_true> *)in_stack_fffffffffffffe30,
             (initializer_list<duckdb::LogicalType>)in_stack_fffffffffffffe38,
             in_stack_fffffffffffffe28);
  vector<duckdb::LogicalType,_true>::operator=
            ((vector<duckdb::LogicalType,_true> *)in_stack_fffffffffffffe30,
             (vector<duckdb::LogicalType,_true> *)in_stack_fffffffffffffe28);
  vector<duckdb::LogicalType,_true>::~vector((vector<duckdb::LogicalType,_true> *)0xdefb55);
  ::std::allocator<duckdb::LogicalType>::~allocator((allocator<duckdb::LogicalType> *)0xdefb62);
  local_160 = (undefined1 **)&local_c0;
  do {
    local_160 = local_160 + -3;
    LogicalType::~LogicalType((LogicalType *)0xdefb8b);
  } while (local_160 != local_d8);
  unique_ptr<duckdb::LogicalOperator,std::default_delete<duckdb::LogicalOperator>,true>::
  unique_ptr<duckdb::LogicalVacuum,std::default_delete<std::unique_ptr<duckdb::LogicalOperator,std::default_delete<duckdb::LogicalOperator>>>,void>
            ((unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>
              *)in_stack_fffffffffffffe30,
             (unique_ptr<duckdb::LogicalVacuum,_std::default_delete<duckdb::LogicalVacuum>_> *)
             in_stack_fffffffffffffe28);
  unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>::operator=
            ((unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>
              *)in_stack_fffffffffffffe30,
             (unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>
              *)in_stack_fffffffffffffe28);
  unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>::
  ~unique_ptr((unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>
               *)0xdefbd5);
  pSVar2 = GetStatementProperties(in_stack_fffffffffffffe30);
  pSVar2->return_type = NOTHING;
  local_19 = 1;
  unique_ptr<duckdb::LogicalVacuum,_std::default_delete<duckdb::LogicalVacuum>,_true>::~unique_ptr
            ((unique_ptr<duckdb::LogicalVacuum,_std::default_delete<duckdb::LogicalVacuum>,_true> *)
             0xdefc17);
  unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>::
  ~unique_ptr((unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>
               *)0xdefc24);
  if ((local_19 & 1) == 0) {
    BoundStatement::~BoundStatement((BoundStatement *)in_stack_fffffffffffffe30);
  }
  return in_RDI;
}

Assistant:

BoundStatement Binder::Bind(VacuumStatement &stmt) {
	BoundStatement result;

	unique_ptr<LogicalOperator> root;

	auto vacuum = make_uniq<LogicalVacuum>(std::move(stmt.info));
	BindVacuumTable(*vacuum, root);
	if (root) {
		vacuum->children.push_back(std::move(root));
	}

	result.names = {"Success"};
	result.types = {LogicalType::BOOLEAN};
	result.plan = std::move(vacuum);

	auto &properties = GetStatementProperties();
	properties.return_type = StatementReturnType::NOTHING;
	return result;
}